

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector4 Vector4SubtractValue(Vector4 v,float add)

{
  Vector4 VVar1;
  
  VVar1.x = v.x - add;
  VVar1.y = v.y - add;
  VVar1.w = v.w - add;
  VVar1.z = v.z - add;
  return VVar1;
}

Assistant:

RMAPI Vector4 Vector4SubtractValue(Vector4 v, float add)
{
    Vector4 result = {
        v.x - add,
        v.y - add,
        v.z - add,
        v.w - add
    };
    return result;
}